

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O0

bool mjs::anon_unknown_63::array_some
               (gc_heap_ptr<mjs::global_object> *global,value *this_,
               vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  anon_class_8_1_8991a1f2 local_48;
  anon_class_1_0_00000001 local_39;
  gc_heap_ptr<mjs::global_object> local_38;
  bool local_21;
  vector<mjs::value,_std::allocator<mjs::value>_> *pvStack_20;
  bool some;
  vector<mjs::value,_std::allocator<mjs::value>_> *args_local;
  value *this__local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  local_21 = false;
  pvStack_20 = args;
  args_local = (vector<mjs::value,_std::allocator<mjs::value>_> *)this_;
  this__local = (value *)global;
  gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_38,global);
  local_48.some = &local_21;
  (anonymous_namespace)::
  for_each_helper<mjs::(anonymous_namespace)::array_some(mjs::gc_heap_ptr<mjs::global_object>const&,mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)::__0,mjs::(anonymous_namespace)::array_some(mjs::gc_heap_ptr<mjs::global_object>const&,mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)::__1>
            (&local_38,(value *)args_local,pvStack_20,&local_39,&local_48);
  gc_heap_ptr<mjs::global_object>::~gc_heap_ptr(&local_38);
  return (bool)(local_21 & 1);
}

Assistant:

bool array_some(const gc_heap_ptr<global_object>& global, const value& this_, const std::vector<value>& args) {
    bool some = false;
    for_each_helper(global, this_, args, [](uint32_t){}, [&some](uint32_t, const value& v) {
        if (to_boolean(v)) {
            some = true;
            return false;
        }
        return true;
    });
    return some;
}